

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-core.c
# Opt level: O2

void media_player2_proxy_iface_init(MediaPlayer2Iface *iface)

{
  iface->get_can_quit = media_player2_proxy_get_can_quit;
  iface->get_fullscreen = media_player2_proxy_get_fullscreen;
  iface->get_can_set_fullscreen = media_player2_proxy_get_can_set_fullscreen;
  iface->get_can_raise = media_player2_proxy_get_can_raise;
  iface->get_has_track_list = media_player2_proxy_get_has_track_list;
  iface->get_identity = media_player2_proxy_get_identity;
  iface->get_desktop_entry = media_player2_proxy_get_desktop_entry;
  iface->get_supported_uri_schemes = media_player2_proxy_get_supported_uri_schemes;
  iface->get_supported_mime_types = media_player2_proxy_get_supported_mime_types;
  return;
}

Assistant:

static void
media_player2_proxy_iface_init (MediaPlayer2Iface *iface)
{
  iface->get_can_quit = media_player2_proxy_get_can_quit;
  iface->get_fullscreen = media_player2_proxy_get_fullscreen;
  iface->get_can_set_fullscreen = media_player2_proxy_get_can_set_fullscreen;
  iface->get_can_raise = media_player2_proxy_get_can_raise;
  iface->get_has_track_list = media_player2_proxy_get_has_track_list;
  iface->get_identity = media_player2_proxy_get_identity;
  iface->get_desktop_entry = media_player2_proxy_get_desktop_entry;
  iface->get_supported_uri_schemes = media_player2_proxy_get_supported_uri_schemes;
  iface->get_supported_mime_types = media_player2_proxy_get_supported_mime_types;
}